

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O0

void __thiscall setup::language_entry::load(language_entry *this,istream *is,info *i)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  codepage_id cVar4;
  int_adapter<unsigned_int> *in_RDX;
  istream *in_RSI;
  slice_reader *in_RDI;
  binary_string *in_stack_ffffffffffffff38;
  istream *in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff50;
  istream *lead_bytes;
  istream *piVar5;
  codepage_id codepage;
  istream *data;
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_68 [8];
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_60 [8];
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_58 [8];
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_50 [8];
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_48 [8];
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_40 [8];
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_38 [8];
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_30 [8];
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_28 [8];
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_20 [8];
  int_adapter<unsigned_int> *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x3ffffff < uVar2) {
    boost::unordered::iterator_detail::
    iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
              (local_20,in_RDI);
    util::operator>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  data = local_10;
  boost::unordered::iterator_detail::
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
            (local_28,(slice_reader *)((long)&(in_RDI->dir).m_pathname.field_2 + 8));
  util::operator>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  iVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (iVar3 == 0x5050701) {
    util::binary_string::skip(in_stack_ffffffffffffff40);
  }
  boost::unordered::iterator_detail::
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
            (local_30,(slice_reader *)((long)&(in_RDI->base_file).field_2 + 8));
  util::operator>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  boost::unordered::iterator_detail::
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
            (local_38,(slice_reader *)((long)&(in_RDI->base_file2).field_2 + 8));
  util::operator>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  lead_bytes = local_10;
  boost::unordered::iterator_detail::
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
            (local_40,(slice_reader *)&in_RDI->ifs);
  util::operator>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  piVar5 = local_10;
  boost::unordered::iterator_detail::
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
            (local_48,(slice_reader *)
                      &(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                       super_basic_istream<char,_std::char_traits<char>_>.field_0x20);
  codepage = (codepage_id)((ulong)piVar5 >> 0x20);
  util::operator>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x3ffffff < uVar2) {
    boost::unordered::iterator_detail::
    iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
              (local_50,(slice_reader *)
                        &(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                         super_basic_istream<char,_std::char_traits<char>_>.field_0x40);
    util::operator>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x4000100) {
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
  }
  else {
    in_stack_ffffffffffffff40 = local_10;
    boost::unordered::iterator_detail::
    iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
              (local_58,(slice_reader *)
                        &(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                         super_basic_istream<char,_std::char_traits<char>_>.field_0x60);
    util::operator>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    boost::unordered::iterator_detail::
    iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
              (local_60,(slice_reader *)
                        &(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                         super_basic_istream<char,_std::char_traits<char>_>.field_0x80);
    util::operator>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff50 = (uint32_t)local_10;
    boost::unordered::iterator_detail::
    iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
              (local_68,(slice_reader *)
                        &(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                         super_basic_istream<char,_std::char_traits<char>_>.field_0xa0);
    util::operator>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  uVar2 = util::load<unsigned_int>((istream *)0x1883b7);
  *(uint *)&(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
            super_basic_istream<char,_std::char_traits<char>_>.field_0xc0 = uVar2;
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x4020200) {
    cVar4 = anon_unknown_0::default_codepage_for_language(in_stack_ffffffffffffff50);
    *(codepage_id *)
     &(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
      super_basic_istream<char,_std::char_traits<char>_>.field_0xc4 = cVar4;
  }
  else {
    bVar1 = setup::version::is_unicode((version *)in_stack_ffffffffffffff40);
    if (bVar1) {
      uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
      if (uVar2 < 0x5030000) {
        util::load<unsigned_int>((istream *)0x18845d);
      }
      *(undefined4 *)
       &(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
        super_basic_istream<char,_std::char_traits<char>_>.field_0xc4 = 0x4b0;
    }
    else {
      uVar2 = util::load<unsigned_int>((istream *)0x188415);
      *(uint *)&(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                super_basic_istream<char,_std::char_traits<char>_>.field_0xc4 = uVar2;
      if (*(int *)&(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                   super_basic_istream<char,_std::char_traits<char>_>.field_0xc4 == 0) {
        *(undefined4 *)
         &(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
          super_basic_istream<char,_std::char_traits<char>_>.field_0xc4 = 0x4e4;
      }
    }
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x4020200) {
    util::to_utf8((string *)data,codepage,(bitset<256UL> *)lead_bytes);
  }
  else {
    util::to_utf8((string *)data,codepage,(bitset<256UL> *)lead_bytes);
  }
  uVar2 = util::load<unsigned_int>((istream *)0x1884c3);
  *(ulong *)&(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
             super_basic_istream<char,_std::char_traits<char>_>.field_0xc8 = (ulong)uVar2;
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x4010000) {
    uVar2 = util::load<unsigned_int>((istream *)0x1884f4);
    *(ulong *)&(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
               super_basic_istream<char,_std::char_traits<char>_>.field_0xd0 = (ulong)uVar2;
  }
  else {
    *(undefined8 *)
     &(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
      super_basic_istream<char,_std::char_traits<char>_>.field_0xd0 = 0;
  }
  uVar2 = util::load<unsigned_int>((istream *)0x188523);
  *(ulong *)&(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
             super_basic_istream<char,_std::char_traits<char>_>.field_0xd8 = (ulong)uVar2;
  uVar2 = util::load<unsigned_int>((istream *)0x188540);
  *(ulong *)&(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
             super_basic_istream<char,_std::char_traits<char>_>.field_0xe0 = (ulong)uVar2;
  uVar2 = util::load<unsigned_int>((istream *)0x18855d);
  *(ulong *)&(in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
             super_basic_istream<char,_std::char_traits<char>_>.field_0xe8 = (ulong)uVar2;
  iVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (iVar3 == 0x5050701) {
    util::load<unsigned_int>((istream *)0x18858e);
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x5020300) {
    (in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
    super_basic_istream<char,_std::char_traits<char>_>.field_0xf0 = 0;
  }
  else {
    bVar1 = util::load_bool((istream *)0x1885af);
    (in_RDI->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
    super_basic_istream<char,_std::char_traits<char>_>.field_0xf0 = bVar1;
  }
  return;
}

Assistant:

void language_entry::load(std::istream & is, const info & i) {
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		is >> util::binary_string(name);
	}
	
	is >> util::binary_string(language_name);
	
	if(i.version == INNO_VERSION_EXT(5, 5, 7, 1)) {
		util::binary_string::skip(is);
	}
	
	is >> util::binary_string(dialog_font);
	is >> util::binary_string(title_font);
	is >> util::binary_string(welcome_font);
	is >> util::binary_string(copyright_font);
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		is >> util::binary_string(data);
	}
	
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::binary_string(license_text);
		is >> util::binary_string(info_before);
		is >> util::binary_string(info_after);
	} else {
		license_text.clear(), info_before.clear(), info_after.clear();
	}
	
	language_id = util::load<boost::uint32_t>(is);
	
	if(i.version < INNO_VERSION(4, 2, 2)) {
		codepage = default_codepage_for_language(language_id);
	} else if(!i.version.is_unicode()) {
		codepage = util::load<boost::uint32_t>(is);
		if(!codepage) {
			codepage = util::cp_windows1252;
		}
	} else {
		if(i.version < INNO_VERSION(5, 3, 0)) {
			(void)util::load<boost::uint32_t>(is);
		}
		codepage = util::cp_utf16le;
	}
	
	if(i.version >= INNO_VERSION(4, 2, 2)) {
		util::to_utf8(language_name, util::cp_utf16le);
	} else {
		util::to_utf8(language_name, codepage);
	}
	
	dialog_font_size = util::load<boost::uint32_t>(is);
	
	if(i.version < INNO_VERSION(4, 1, 0)) {
		dialog_font_standard_height = util::load<boost::uint32_t>(is);
	} else {
		dialog_font_standard_height = 0;
	}
	
	title_font_size = util::load<boost::uint32_t>(is);
	welcome_font_size = util::load<boost::uint32_t>(is);
	copyright_font_size = util::load<boost::uint32_t>(is);
	
	if(i.version == INNO_VERSION_EXT(5, 5, 7, 1)) {
		util::load<boost::uint32_t>(is); // always 8 or 9?
	}
	
	if(i.version >= INNO_VERSION(5, 2, 3)) {
		right_to_left = util::load_bool(is);
	} else {
		right_to_left = false;
	}
	
}